

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sqlite3 *db_00;
  Table *pTVar1;
  int iVar2;
  sColMap *z_00;
  FKey *pFVar3;
  int local_70;
  int n;
  int j;
  int iCol;
  char *z;
  int local_58;
  int nCol;
  int i;
  int nByte;
  Table *p;
  FKey *pNextTo;
  FKey *pFKey;
  sqlite3 *db;
  int flags_local;
  ExprList *pToCol_local;
  Token *pTo_local;
  ExprList *pFromCol_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pNextTo = (FKey *)0x0;
  pTVar1 = pParse->pNewTable;
  if ((pTVar1 == (Table *)0x0) || (pParse->eParseMode == '\x01')) goto LAB_001636c2;
  if (pFromCol == (ExprList *)0x0) {
    iVar2 = pTVar1->nCol + -1;
    if (iVar2 < 0) goto LAB_001636c2;
    if ((pToCol != (ExprList *)0x0) && (pToCol->nExpr != 1)) {
      sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                      pTVar1->aCol[iVar2].zName,pTo);
      goto LAB_001636c2;
    }
    z._4_4_ = 1;
  }
  else {
    if ((pToCol != (ExprList *)0x0) && (pToCol->nExpr != pFromCol->nExpr)) {
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
      goto LAB_001636c2;
    }
    z._4_4_ = pFromCol->nExpr;
  }
  nCol = (z._4_4_ + -1) * 0x10 + pTo->n + 0x51;
  if (pToCol != (ExprList *)0x0) {
    for (local_58 = 0; local_58 < pToCol->nExpr; local_58 = local_58 + 1) {
      iVar2 = sqlite3Strlen30(pToCol->a[local_58].zName);
      nCol = iVar2 + 1 + nCol;
    }
  }
  pNextTo = (FKey *)sqlite3DbMallocZero(db_00,(long)nCol);
  if (pNextTo != (FKey *)0x0) {
    pNextTo->pFrom = pTVar1;
    pNextTo->pNextFrom = pTVar1->pFKey;
    z_00 = pNextTo->aCol + z._4_4_;
    pNextTo->zTo = (char *)z_00;
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,z_00,pTo);
    }
    memcpy(z_00,pTo->z,(ulong)pTo->n);
    *(char *)((long)&z_00->iFrom + (ulong)pTo->n) = '\0';
    sqlite3Dequote((char *)z_00);
    _j = (char *)((long)&z_00->iFrom + (ulong)(pTo->n + 1));
    pNextTo->nCol = z._4_4_;
    if (pFromCol == (ExprList *)0x0) {
      pNextTo->aCol[0].iFrom = pTVar1->nCol + -1;
    }
    else {
      for (local_58 = 0; local_58 < z._4_4_; local_58 = local_58 + 1) {
        for (local_70 = 0; local_70 < pTVar1->nCol; local_70 = local_70 + 1) {
          iVar2 = sqlite3StrICmp(pTVar1->aCol[local_70].zName,pFromCol->a[local_58].zName);
          if (iVar2 == 0) {
            pNextTo->aCol[local_58].iFrom = local_70;
            break;
          }
        }
        if (pTVar1->nCol <= local_70) {
          sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                          pFromCol->a[local_58].zName);
          goto LAB_001636c2;
        }
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenRemap(pParse,pNextTo->aCol + local_58,pFromCol->a[local_58].zName);
        }
      }
    }
    if (pToCol != (ExprList *)0x0) {
      for (local_58 = 0; local_58 < z._4_4_; local_58 = local_58 + 1) {
        iVar2 = sqlite3Strlen30(pToCol->a[local_58].zName);
        pNextTo->aCol[local_58].zCol = _j;
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenRemap(pParse,_j,pToCol->a[local_58].zName);
        }
        memcpy(_j,pToCol->a[local_58].zName,(long)iVar2);
        _j[iVar2] = '\0';
        _j = _j + (iVar2 + 1);
      }
    }
    pNextTo->isDeferred = '\0';
    pNextTo->aAction[0] = (u8)flags;
    pNextTo->aAction[1] = (u8)((uint)flags >> 8);
    pFVar3 = (FKey *)sqlite3HashInsert(&pTVar1->pSchema->fkeyHash,pNextTo->zTo,pNextTo);
    if (pFVar3 == pNextTo) {
      sqlite3OomFault(db_00);
    }
    else {
      if (pFVar3 != (FKey *)0x0) {
        pNextTo->pNextTo = pFVar3;
        pFVar3->pPrevTo = pNextTo;
      }
      pTVar1->pFKey = pNextTo;
      pNextTo = (FKey *)0x0;
    }
  }
LAB_001636c2:
  sqlite3DbFree(db_00,pNextTo);
  sqlite3ExprListDelete(db_00,pFromCol);
  sqlite3ExprListDelete(db_00,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zName);
      }
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}